

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utility.cpp
# Opt level: O3

pair<int,_int> FIX::socket_createpair(void)

{
  socket_handle pair [2];
  pair<int,_int> local_10;
  
  socketpair(1,1,0,&local_10.first);
  return local_10;
}

Assistant:

std::pair<socket_handle, socket_handle> socket_createpair() {
#ifdef _MSC_VER
  socket_handle acceptor = socket_createAcceptor(0, true);
  const char *host = socket_hostname(acceptor);
  short port = socket_hostport(acceptor);
  socket_handle client = socket_createConnector();
  socket_connect(client, "localhost", port);
  socket_handle server = socket_accept(acceptor);
  socket_close(acceptor);
  return std::make_pair(client, server);
#else
  socket_handle pair[2];
  socketpair(AF_UNIX, SOCK_STREAM, 0, pair);
  return std::make_pair(pair[0], pair[1]);
#endif
}